

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# afcjk.c
# Opt level: O1

FT_Error af_cjk_metrics_init(AF_CJKMetrics metrics,FT_Face face)

{
  ushort uVar1;
  AF_Blue_Stringset AVar2;
  FT_GlyphSlot_conflict pFVar3;
  FT_Vector *pFVar4;
  bool bVar5;
  FT_Face pFVar6;
  FT_Error FVar7;
  AF_Blue_String AVar8;
  uint uVar9;
  AF_CJKMetrics buf_;
  FT_ULong FVar10;
  AF_CJKBlueRec *pAVar11;
  long lVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  FT_Pos *pFVar16;
  FT_Vector *pFVar17;
  FT_CharMap charmap;
  AF_StyleMetrics_conflict p;
  byte bVar18;
  undefined7 uVar19;
  AF_StyleMetrics_conflict metrics_00;
  AF_Blue_StringRec *pAVar20;
  long lVar21;
  int iVar22;
  int iVar23;
  int iVar24;
  uint uVar25;
  ulong uVar26;
  FT_Pos flats [51];
  FT_Pos fills [51];
  ulong local_3a8;
  uint local_39c;
  FT_Face local_398;
  FT_CharMap local_390;
  AF_CJKAxisRec *local_388;
  AF_CJKAxisRec *local_380;
  AF_CJKAxisRec *local_378;
  AF_Blue_StringRec *local_370;
  long alStack_368 [52];
  long alStack_1c8 [51];
  
  charmap = face->charmap;
  metrics->units_per_em = (uint)face->units_per_EM;
  FVar7 = FT_Select_Charmap(face,FT_ENCODING_UNICODE);
  if (FVar7 == 0) {
    local_398 = face;
    local_390 = charmap;
    af_cjk_metrics_init_widths(metrics,face);
    AVar2 = ((metrics->root).style_class)->blue_stringset;
    buf_ = (AF_CJKMetrics)hb_buffer_create();
    AVar8 = af_blue_stringsets[AVar2].string;
    if (AVar8 != AF_BLUE_STRING_MAX) {
      pAVar20 = af_blue_stringsets + AVar2;
      local_380 = metrics->axis;
      local_388 = metrics->axis + 1;
      do {
        uVar1 = pAVar20->properties;
        local_378 = local_380;
        if ((uVar1 & 2) == 0) {
          local_378 = local_388;
        }
        local_3a8._0_4_ = 0;
        uVar25 = 0;
        local_370 = pAVar20;
        if (af_blue_strings[AVar8] != '\0') {
          p = (AF_StyleMetrics_conflict)(af_blue_strings + AVar8);
          bVar5 = true;
          uVar26 = 0;
          local_3a8 = 0;
          do {
            for (; *(char *)&p->style_class == ' ';
                p = (AF_StyleMetrics_conflict)((long)&p->style_class + 1)) {
            }
            if (*(char *)&p->style_class == '|') {
              p = (AF_StyleMetrics_conflict)((long)&p->style_class + 1);
              bVar5 = false;
            }
            else {
              face = (FT_Face)metrics;
              metrics_00 = p;
              p = (AF_StyleMetrics_conflict)
                  af_shaper_get_cluster((char *)p,&metrics->root,buf_,&local_39c);
              if ((local_39c < 2) &&
                 (face = (FT_Face)buf_,
                 FVar10 = af_shaper_get_elem(metrics_00,buf_,0,(FT_Long *)0x0,(FT_Long *)0x0),
                 pFVar6 = local_398, FVar10 != 0)) {
                face = (FT_Face)(FVar10 & 0xffffffff);
                FVar7 = FT_Load_Glyph(local_398,(FT_UInt)FVar10,1);
                if ((FVar7 == 0) && (pFVar3 = pFVar6->glyph, 2 < (pFVar3->outline).n_points)) {
                  lVar14 = (long)(pFVar3->outline).n_contours;
                  if (lVar14 < 1) {
                    lVar12 = 0;
                  }
                  else {
                    pFVar4 = (pFVar3->outline).points;
                    face = (FT_Face)(pFVar3->outline).contours;
                    iVar22 = -1;
                    lVar21 = 0;
                    iVar23 = 0;
                    lVar12 = 0;
                    do {
                      iVar24 = (int)*(short *)((long)((AF_CJKMetrics)face)->axis[0].widths +
                                              lVar21 * 2 + -0x68);
                      if (iVar23 < iVar24) {
                        lVar15 = (long)iVar23;
                        if ((uVar1 & 2) == 0) {
                          pFVar16 = &pFVar4[lVar15].y;
                          lVar15 = (iVar24 - lVar15) + 1;
                          if ((uVar1 & 1) == 0) {
                            do {
                              if ((iVar22 < 0) || (*pFVar16 < lVar12)) {
                                lVar12 = *pFVar16;
                                iVar22 = iVar23;
                              }
                              iVar23 = iVar23 + 1;
                              pFVar16 = pFVar16 + 2;
                              lVar15 = lVar15 + -1;
                            } while (lVar15 != 0);
                          }
                          else {
                            do {
                              if ((iVar22 < 0) || (lVar12 < *pFVar16)) {
                                lVar12 = *pFVar16;
                                iVar22 = iVar23;
                              }
                              iVar23 = iVar23 + 1;
                              pFVar16 = pFVar16 + 2;
                              lVar15 = lVar15 + -1;
                            } while (lVar15 != 0);
                          }
                        }
                        else {
                          pFVar17 = pFVar4 + lVar15;
                          lVar15 = (iVar24 - lVar15) + 1;
                          if ((uVar1 & 1) == 0) {
                            do {
                              if ((iVar22 < 0) || (pFVar17->x < lVar12)) {
                                lVar12 = pFVar17->x;
                                iVar22 = iVar23;
                              }
                              iVar23 = iVar23 + 1;
                              pFVar17 = pFVar17 + 1;
                              lVar15 = lVar15 + -1;
                            } while (lVar15 != 0);
                          }
                          else {
                            do {
                              if ((iVar22 < 0) || (lVar12 < pFVar17->x)) {
                                lVar12 = pFVar17->x;
                                iVar22 = iVar23;
                              }
                              iVar23 = iVar23 + 1;
                              pFVar17 = pFVar17 + 1;
                              lVar15 = lVar15 + -1;
                            } while (lVar15 != 0);
                          }
                        }
                      }
                      iVar23 = iVar24 + 1;
                      lVar21 = lVar21 + 1;
                    } while (lVar21 != lVar14);
                  }
                  if (bVar5) {
                    alStack_1c8[uVar26] = lVar12;
                    uVar26 = (ulong)((int)uVar26 + 1);
                  }
                  else {
                    alStack_368[local_3a8] = lVar12;
                    local_3a8 = (ulong)((int)local_3a8 + 1);
                  }
                }
              }
            }
            uVar25 = (uint)uVar26;
          } while (*(char *)&p->style_class != '\0');
        }
        if ((uint)local_3a8 != 0 || uVar25 != 0) {
          if (1 < uVar25) {
            uVar9 = 1;
            do {
              uVar26 = (ulong)uVar9;
              do {
                lVar14 = alStack_1c8[uVar26];
                uVar13 = (ulong)((int)uVar26 - 1);
                if (alStack_1c8[uVar13] <= lVar14) break;
                alStack_1c8[uVar26] = alStack_1c8[uVar13];
                alStack_1c8[uVar13] = lVar14;
                uVar26 = uVar13;
              } while (uVar13 != 0);
              uVar9 = uVar9 + 1;
            } while (uVar9 != uVar25);
          }
          if (1 < (uint)local_3a8) {
            uVar9 = 1;
            do {
              uVar26 = (ulong)uVar9;
              do {
                lVar14 = alStack_368[uVar26];
                uVar13 = (ulong)((int)uVar26 - 1);
                if (alStack_368[uVar13] <= lVar14) break;
                alStack_368[uVar26] = alStack_368[uVar13];
                alStack_368[uVar13] = lVar14;
                uVar26 = uVar13;
              } while (uVar13 != 0);
              uVar9 = uVar9 + 1;
            } while (uVar9 != (uint)local_3a8);
          }
          uVar9 = local_378->blue_count;
          pAVar11 = local_378->blues + uVar9;
          local_378->blue_count = uVar9 + 1;
          if ((uint)local_3a8 == 0) {
            lVar14 = alStack_1c8[uVar25 >> 1];
LAB_0017e17a:
            local_378->blues[uVar9].shoot.org = lVar14;
            (pAVar11->ref).org = lVar14;
          }
          else {
            if (uVar25 == 0) {
              lVar14 = alStack_368[(uint)local_3a8 >> 1];
              goto LAB_0017e17a;
            }
            (pAVar11->ref).org = alStack_1c8[uVar25 >> 1];
            local_378->blues[uVar9].shoot.org = alStack_368[(uint)local_3a8 >> 1];
          }
          lVar14 = (pAVar11->ref).org;
          lVar12 = local_378->blues[uVar9].shoot.org;
          uVar19 = (undefined7)((ulong)local_378 >> 8);
          face = (FT_Face)CONCAT71(uVar19,lVar14 <= lVar12);
          if ((lVar12 != lVar14) &&
             (bVar18 = lVar14 <= lVar12 ^ (byte)uVar1, face = (FT_Face)CONCAT71(uVar19,bVar18),
             (bVar18 & 1) == 0)) {
            lVar14 = (lVar14 + lVar12) / 2;
            local_378->blues[uVar9].shoot.org = lVar14;
            (pAVar11->ref).org = lVar14;
          }
          local_378->blues[uVar9].flags = (uint)uVar1 * 2 & 2;
        }
        AVar8 = local_370[1].string;
        pAVar20 = local_370 + 1;
      } while (AVar8 != AF_BLUE_STRING_MAX);
    }
    hb_buffer_destroy(buf_);
    af_cjk_metrics_check_digits(metrics,face);
    charmap = local_390;
    face = local_398;
  }
  FT_Set_Charmap(face,charmap);
  return 0;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  af_cjk_metrics_init( AF_CJKMetrics  metrics,
                       FT_Face        face )
  {
    FT_CharMap  oldmap = face->charmap;


    metrics->units_per_em = face->units_per_EM;

    if ( !FT_Select_Charmap( face, FT_ENCODING_UNICODE ) )
    {
      af_cjk_metrics_init_widths( metrics, face );
      af_cjk_metrics_init_blues( metrics, face );
      af_cjk_metrics_check_digits( metrics, face );
    }

    FT_Set_Charmap( face, oldmap );
    return FT_Err_Ok;
  }